

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.cpp
# Opt level: O2

Iterator __thiscall Kernel::Inference::iterator(Inference *this)

{
  if ((byte)((*(byte *)this & 3) - 1) < 2) {
    return (Iterator)this->_ptr1;
  }
  return (Iterator)(anon_union_8_2_756040a0_for_Iterator_0)0x0;
}

Assistant:

Inference::Iterator Inference::iterator() const
{
  Iterator it;
  switch(_kind) {
    case Kind::INFERENCE_012:
      it.integer=0;
      break;
    case Kind::INFERENCE_MANY:
    case Kind::INFERENCE_FROM_SAT_REFUTATION:
      it.pointer = _ptr1;
      break;
  }

  return it;
}